

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeTextureApiTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::teximage2d_max_width_height
               (NegativeTestContext *ctx)

{
  NegativeTestContext *pNVar1;
  allocator<char> local_161;
  string local_160;
  allocator<char> local_139;
  string local_138;
  allocator<char> local_111;
  string local_110;
  allocator<char> local_e9;
  string local_e8;
  allocator<char> local_c1;
  string local_c0;
  allocator<char> local_99;
  string local_98;
  allocator<char> local_71;
  string local_70;
  allocator<char> local_39;
  string local_38;
  int local_18;
  int local_14;
  int maxCubemapSize;
  int maxTextureSize;
  NegativeTestContext *ctx_local;
  
  _maxCubemapSize = ctx;
  local_14 = NegativeTestContext::getInteger(ctx,0xd33);
  local_14 = local_14 + 1;
  local_18 = NegativeTestContext::getInteger(_maxCubemapSize,0x851c);
  pNVar1 = _maxCubemapSize;
  local_18 = local_18 + 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,
             "GL_INVALID_VALUE is generated if width or height is greater than GL_MAX_TEXTURE_SIZE."
             ,&local_39);
  NegativeTestContext::beginSection(pNVar1,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  glu::CallLogWrapper::glTexImage2D
            (&_maxCubemapSize->super_CallLogWrapper,0xde1,0,0x1907,local_14,1,0,0x1907,0x1401,
             (void *)0x0);
  NegativeTestContext::expectError(_maxCubemapSize,0x501);
  glu::CallLogWrapper::glTexImage2D
            (&_maxCubemapSize->super_CallLogWrapper,0xde1,0,0x1907,1,local_14,0,0x1907,0x1401,
             (void *)0x0);
  NegativeTestContext::expectError(_maxCubemapSize,0x501);
  glu::CallLogWrapper::glTexImage2D
            (&_maxCubemapSize->super_CallLogWrapper,0xde1,0,0x1907,local_14,local_14,0,0x1907,0x1401
             ,(void *)0x0);
  NegativeTestContext::expectError(_maxCubemapSize,0x501);
  NegativeTestContext::endSection(_maxCubemapSize);
  pNVar1 = _maxCubemapSize;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,
             "GL_INVALID_VALUE is generated if width or height is greater than GL_MAX_CUBE_MAP_TEXTURE_SIZE."
             ,&local_71);
  NegativeTestContext::beginSection(pNVar1,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  pNVar1 = _maxCubemapSize;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"GL_TEXTURE_CUBE_MAP_POSITIVE_X target",&local_99);
  NegativeTestContext::beginSection(pNVar1,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator(&local_99);
  glu::CallLogWrapper::glTexImage2D
            (&_maxCubemapSize->super_CallLogWrapper,0x8515,0,0x1907,local_18,1,0,0x1907,0x1401,
             (void *)0x0);
  NegativeTestContext::expectError(_maxCubemapSize,0x501);
  glu::CallLogWrapper::glTexImage2D
            (&_maxCubemapSize->super_CallLogWrapper,0x8515,0,0x1907,1,local_18,0,0x1907,0x1401,
             (void *)0x0);
  NegativeTestContext::expectError(_maxCubemapSize,0x501);
  glu::CallLogWrapper::glTexImage2D
            (&_maxCubemapSize->super_CallLogWrapper,0x8515,0,0x1907,local_18,local_18,0,0x1907,
             0x1401,(void *)0x0);
  NegativeTestContext::expectError(_maxCubemapSize,0x501);
  NegativeTestContext::endSection(_maxCubemapSize);
  pNVar1 = _maxCubemapSize;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,"GL_TEXTURE_CUBE_MAP_POSITIVE_Y target",&local_c1);
  NegativeTestContext::beginSection(pNVar1,&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator(&local_c1);
  glu::CallLogWrapper::glTexImage2D
            (&_maxCubemapSize->super_CallLogWrapper,0x8517,0,0x1907,local_18,1,0,0x1907,0x1401,
             (void *)0x0);
  NegativeTestContext::expectError(_maxCubemapSize,0x501);
  glu::CallLogWrapper::glTexImage2D
            (&_maxCubemapSize->super_CallLogWrapper,0x8517,0,0x1907,1,local_18,0,0x1907,0x1401,
             (void *)0x0);
  NegativeTestContext::expectError(_maxCubemapSize,0x501);
  glu::CallLogWrapper::glTexImage2D
            (&_maxCubemapSize->super_CallLogWrapper,0x8517,0,0x1907,local_18,local_18,0,0x1907,
             0x1401,(void *)0x0);
  NegativeTestContext::expectError(_maxCubemapSize,0x501);
  NegativeTestContext::endSection(_maxCubemapSize);
  pNVar1 = _maxCubemapSize;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"GL_TEXTURE_CUBE_MAP_POSITIVE_Z target",&local_e9);
  NegativeTestContext::beginSection(pNVar1,&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::allocator<char>::~allocator(&local_e9);
  glu::CallLogWrapper::glTexImage2D
            (&_maxCubemapSize->super_CallLogWrapper,0x8519,0,0x1907,local_18,1,0,0x1907,0x1401,
             (void *)0x0);
  NegativeTestContext::expectError(_maxCubemapSize,0x501);
  glu::CallLogWrapper::glTexImage2D
            (&_maxCubemapSize->super_CallLogWrapper,0x8519,0,0x1907,1,local_18,0,0x1907,0x1401,
             (void *)0x0);
  NegativeTestContext::expectError(_maxCubemapSize,0x501);
  glu::CallLogWrapper::glTexImage2D
            (&_maxCubemapSize->super_CallLogWrapper,0x8519,0,0x1907,local_18,local_18,0,0x1907,
             0x1401,(void *)0x0);
  NegativeTestContext::expectError(_maxCubemapSize,0x501);
  NegativeTestContext::endSection(_maxCubemapSize);
  pNVar1 = _maxCubemapSize;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_110,"GL_TEXTURE_CUBE_MAP_NEGATIVE_X target",&local_111);
  NegativeTestContext::beginSection(pNVar1,&local_110);
  std::__cxx11::string::~string((string *)&local_110);
  std::allocator<char>::~allocator(&local_111);
  glu::CallLogWrapper::glTexImage2D
            (&_maxCubemapSize->super_CallLogWrapper,0x8516,0,0x1907,local_18,1,0,0x1907,0x1401,
             (void *)0x0);
  NegativeTestContext::expectError(_maxCubemapSize,0x501);
  glu::CallLogWrapper::glTexImage2D
            (&_maxCubemapSize->super_CallLogWrapper,0x8516,0,0x1907,1,local_18,0,0x1907,0x1401,
             (void *)0x0);
  NegativeTestContext::expectError(_maxCubemapSize,0x501);
  glu::CallLogWrapper::glTexImage2D
            (&_maxCubemapSize->super_CallLogWrapper,0x8516,0,0x1907,local_18,local_18,0,0x1907,
             0x1401,(void *)0x0);
  NegativeTestContext::expectError(_maxCubemapSize,0x501);
  NegativeTestContext::endSection(_maxCubemapSize);
  pNVar1 = _maxCubemapSize;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_138,"GL_TEXTURE_CUBE_MAP_NEGATIVE_Y target",&local_139);
  NegativeTestContext::beginSection(pNVar1,&local_138);
  std::__cxx11::string::~string((string *)&local_138);
  std::allocator<char>::~allocator(&local_139);
  glu::CallLogWrapper::glTexImage2D
            (&_maxCubemapSize->super_CallLogWrapper,0x8518,0,0x1907,local_18,1,0,0x1907,0x1401,
             (void *)0x0);
  NegativeTestContext::expectError(_maxCubemapSize,0x501);
  glu::CallLogWrapper::glTexImage2D
            (&_maxCubemapSize->super_CallLogWrapper,0x8518,0,0x1907,1,local_18,0,0x1907,0x1401,
             (void *)0x0);
  NegativeTestContext::expectError(_maxCubemapSize,0x501);
  glu::CallLogWrapper::glTexImage2D
            (&_maxCubemapSize->super_CallLogWrapper,0x8518,0,0x1907,local_18,local_18,0,0x1907,
             0x1401,(void *)0x0);
  NegativeTestContext::expectError(_maxCubemapSize,0x501);
  NegativeTestContext::endSection(_maxCubemapSize);
  pNVar1 = _maxCubemapSize;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_160,"GL_TEXTURE_CUBE_MAP_NEGATIVE_Z target",&local_161);
  NegativeTestContext::beginSection(pNVar1,&local_160);
  std::__cxx11::string::~string((string *)&local_160);
  std::allocator<char>::~allocator(&local_161);
  glu::CallLogWrapper::glTexImage2D
            (&_maxCubemapSize->super_CallLogWrapper,0x851a,0,0x1907,local_18,1,0,0x1907,0x1401,
             (void *)0x0);
  NegativeTestContext::expectError(_maxCubemapSize,0x501);
  glu::CallLogWrapper::glTexImage2D
            (&_maxCubemapSize->super_CallLogWrapper,0x851a,0,0x1907,1,local_18,0,0x1907,0x1401,
             (void *)0x0);
  NegativeTestContext::expectError(_maxCubemapSize,0x501);
  glu::CallLogWrapper::glTexImage2D
            (&_maxCubemapSize->super_CallLogWrapper,0x851a,0,0x1907,local_18,local_18,0,0x1907,
             0x1401,(void *)0x0);
  NegativeTestContext::expectError(_maxCubemapSize,0x501);
  NegativeTestContext::endSection(_maxCubemapSize);
  NegativeTestContext::endSection(_maxCubemapSize);
  return;
}

Assistant:

void teximage2d_max_width_height (NegativeTestContext& ctx)
{
	int maxTextureSize = ctx.getInteger(GL_MAX_TEXTURE_SIZE) + 1;
	int maxCubemapSize = ctx.getInteger(GL_MAX_CUBE_MAP_TEXTURE_SIZE) + 1;

	ctx.beginSection("GL_INVALID_VALUE is generated if width or height is greater than GL_MAX_TEXTURE_SIZE.");
	ctx.glTexImage2D(GL_TEXTURE_2D, 0, GL_RGB, maxTextureSize, 1, 0, GL_RGB, GL_UNSIGNED_BYTE, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glTexImage2D(GL_TEXTURE_2D, 0, GL_RGB, 1, maxTextureSize, 0, GL_RGB, GL_UNSIGNED_BYTE, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glTexImage2D(GL_TEXTURE_2D, 0, GL_RGB, maxTextureSize, maxTextureSize, 0, GL_RGB, GL_UNSIGNED_BYTE, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_VALUE is generated if width or height is greater than GL_MAX_CUBE_MAP_TEXTURE_SIZE.");

	ctx.beginSection("GL_TEXTURE_CUBE_MAP_POSITIVE_X target");
	ctx.glTexImage2D(GL_TEXTURE_CUBE_MAP_POSITIVE_X, 0, GL_RGB, maxCubemapSize, 1, 0, GL_RGB, GL_UNSIGNED_BYTE, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glTexImage2D(GL_TEXTURE_CUBE_MAP_POSITIVE_X, 0, GL_RGB, 1, maxCubemapSize, 0, GL_RGB, GL_UNSIGNED_BYTE, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glTexImage2D(GL_TEXTURE_CUBE_MAP_POSITIVE_X, 0, GL_RGB, maxCubemapSize, maxCubemapSize, 0, GL_RGB, GL_UNSIGNED_BYTE, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.beginSection("GL_TEXTURE_CUBE_MAP_POSITIVE_Y target");
	ctx.glTexImage2D(GL_TEXTURE_CUBE_MAP_POSITIVE_Y, 0, GL_RGB, maxCubemapSize, 1, 0, GL_RGB, GL_UNSIGNED_BYTE, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glTexImage2D(GL_TEXTURE_CUBE_MAP_POSITIVE_Y, 0, GL_RGB, 1, maxCubemapSize, 0, GL_RGB, GL_UNSIGNED_BYTE, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glTexImage2D(GL_TEXTURE_CUBE_MAP_POSITIVE_Y, 0, GL_RGB, maxCubemapSize, maxCubemapSize, 0, GL_RGB, GL_UNSIGNED_BYTE, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.beginSection("GL_TEXTURE_CUBE_MAP_POSITIVE_Z target");
	ctx.glTexImage2D(GL_TEXTURE_CUBE_MAP_POSITIVE_Z, 0, GL_RGB, maxCubemapSize, 1, 0, GL_RGB, GL_UNSIGNED_BYTE, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glTexImage2D(GL_TEXTURE_CUBE_MAP_POSITIVE_Z, 0, GL_RGB, 1, maxCubemapSize, 0, GL_RGB, GL_UNSIGNED_BYTE, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glTexImage2D(GL_TEXTURE_CUBE_MAP_POSITIVE_Z, 0, GL_RGB, maxCubemapSize, maxCubemapSize, 0, GL_RGB, GL_UNSIGNED_BYTE, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.beginSection("GL_TEXTURE_CUBE_MAP_NEGATIVE_X target");
	ctx.glTexImage2D(GL_TEXTURE_CUBE_MAP_NEGATIVE_X, 0, GL_RGB, maxCubemapSize, 1, 0, GL_RGB, GL_UNSIGNED_BYTE, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glTexImage2D(GL_TEXTURE_CUBE_MAP_NEGATIVE_X, 0, GL_RGB, 1, maxCubemapSize, 0, GL_RGB, GL_UNSIGNED_BYTE, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glTexImage2D(GL_TEXTURE_CUBE_MAP_NEGATIVE_X, 0, GL_RGB, maxCubemapSize, maxCubemapSize, 0, GL_RGB, GL_UNSIGNED_BYTE, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.beginSection("GL_TEXTURE_CUBE_MAP_NEGATIVE_Y target");
	ctx.glTexImage2D(GL_TEXTURE_CUBE_MAP_NEGATIVE_Y, 0, GL_RGB, maxCubemapSize, 1, 0, GL_RGB, GL_UNSIGNED_BYTE, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glTexImage2D(GL_TEXTURE_CUBE_MAP_NEGATIVE_Y, 0, GL_RGB, 1, maxCubemapSize, 0, GL_RGB, GL_UNSIGNED_BYTE, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glTexImage2D(GL_TEXTURE_CUBE_MAP_NEGATIVE_Y, 0, GL_RGB, maxCubemapSize, maxCubemapSize, 0, GL_RGB, GL_UNSIGNED_BYTE, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.beginSection("GL_TEXTURE_CUBE_MAP_NEGATIVE_Z target");
	ctx.glTexImage2D(GL_TEXTURE_CUBE_MAP_NEGATIVE_Z, 0, GL_RGB, maxCubemapSize, 1, 0, GL_RGB, GL_UNSIGNED_BYTE, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glTexImage2D(GL_TEXTURE_CUBE_MAP_NEGATIVE_Z, 0, GL_RGB, 1, maxCubemapSize, 0, GL_RGB, GL_UNSIGNED_BYTE, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glTexImage2D(GL_TEXTURE_CUBE_MAP_NEGATIVE_Z, 0, GL_RGB, maxCubemapSize, maxCubemapSize, 0, GL_RGB, GL_UNSIGNED_BYTE, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.endSection();
}